

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Return_Button.cxx
# Opt level: O1

void __thiscall Fl_Return_Button::draw(Fl_Return_Button *this)

{
  int h;
  int iVar1;
  byte bVar2;
  int iVar3;
  int w;
  
  if ((this->super_Fl_Button).super_Fl_Widget.type_ != '\x03') {
    if ((this->super_Fl_Button).value_ == '\0') {
      bVar2 = (this->super_Fl_Button).super_Fl_Widget.box_;
    }
    else {
      bVar2 = (this->super_Fl_Button).down_box_;
      if (bVar2 == 0) {
        bVar2 = (this->super_Fl_Button).super_Fl_Widget.box_;
        bVar2 = 1 < bVar2 | bVar2;
      }
    }
    iVar3 = Fl::box_dx((uint)bVar2);
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar2,
                        (&(this->super_Fl_Button).super_Fl_Widget.color_)
                        [(this->super_Fl_Button).value_ != '\0']);
    h = (this->super_Fl_Button).super_Fl_Widget.h_;
    iVar1 = (this->super_Fl_Button).super_Fl_Widget.w_;
    w = iVar1 / 3;
    if (h <= w) {
      w = h;
    }
    fl_return_arrow(((this->super_Fl_Button).super_Fl_Widget.x_ + iVar1) - (w + iVar3),
                    (this->super_Fl_Button).super_Fl_Widget.y_,w,h);
    Fl_Widget::draw_label
              ((Fl_Widget *)this,iVar3 + (this->super_Fl_Button).super_Fl_Widget.x_,
               (this->super_Fl_Button).super_Fl_Widget.y_,
               (this->super_Fl_Button).super_Fl_Widget.w_ - (w + iVar3 + iVar3),
               (this->super_Fl_Button).super_Fl_Widget.h_);
    if (Fl::focus_ == (Fl_Widget *)this) {
      Fl_Widget::draw_focus
                ((Fl_Widget *)this,(uint)(this->super_Fl_Button).super_Fl_Widget.box_,
                 (this->super_Fl_Button).super_Fl_Widget.x_,
                 (this->super_Fl_Button).super_Fl_Widget.y_,
                 (this->super_Fl_Button).super_Fl_Widget.w_,
                 (this->super_Fl_Button).super_Fl_Widget.h_);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Return_Button::draw() {
  if (type() == FL_HIDDEN_BUTTON) return;
  Fl_Boxtype bt = value() ? (down_box()?down_box():fl_down(box())) : box();
  int dx = Fl::box_dx(bt);
  draw_box(bt, value() ? selection_color() : color());
  int W = h();
  if (w()/3 < W) W = w()/3;
  fl_return_arrow(x()+w()-(W+dx), y(), W, h());
  draw_label(x()+dx, y(), w()-(dx+W+dx), h());
  if (Fl::focus() == this) draw_focus();
}